

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

void opj_t1_dec_clnpass_generic_novsc(opj_t1_t *t1,OPJ_INT32 bpno)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  OPJ_UINT32 OVar5;
  uint uVar6;
  opj_mqc_state_t **ppoVar7;
  uint *puVar8;
  uint local_1e8;
  uint local_1d8;
  uint local_1c8;
  uint local_1b8;
  uint local_1a8;
  uint local_198;
  uint local_188;
  uint local_178;
  opj_flag_t *south_1;
  OPJ_UINT32 l_c_35;
  OPJ_UINT32 l_c_34;
  OPJ_UINT32 lu_7;
  OPJ_UINT32 l_c_33;
  OPJ_UINT32 l_c_32;
  OPJ_UINT32 ctxt1_6;
  OPJ_UINT32 l_c_31;
  OPJ_UINT32 l_c_30;
  OPJ_UINT32 lu_6;
  OPJ_UINT32 l_c_29;
  OPJ_UINT32 l_c_28;
  OPJ_UINT32 ctxt1_5;
  OPJ_UINT32 l_c_27;
  OPJ_UINT32 l_c_26;
  OPJ_UINT32 lu_5;
  OPJ_UINT32 l_c_25;
  OPJ_UINT32 l_c_24;
  OPJ_UINT32 ctxt1_4;
  opj_flag_t *north_1;
  OPJ_UINT32 l_c_23;
  OPJ_UINT32 l_c_22;
  OPJ_UINT32 lu_4;
  OPJ_UINT32 l_c_21;
  OPJ_UINT32 l_c_20;
  OPJ_UINT32 ctxt1_3;
  opj_flag_t *south;
  OPJ_UINT32 l_c_19;
  OPJ_UINT32 l_c_18;
  OPJ_UINT32 lu_3;
  OPJ_UINT32 l_c_17;
  OPJ_UINT32 l_c_16;
  OPJ_UINT32 ctxt1_2;
  OPJ_UINT32 l_c_15;
  OPJ_UINT32 l_c_14;
  OPJ_UINT32 lu_2;
  OPJ_UINT32 l_c_13;
  OPJ_UINT32 l_c_12;
  OPJ_UINT32 ctxt1_1;
  OPJ_UINT32 l_c_11;
  OPJ_UINT32 l_c_10;
  OPJ_UINT32 lu_1;
  OPJ_UINT32 l_c_9;
  OPJ_UINT32 l_c_8;
  OPJ_UINT32 ctxt1;
  opj_flag_t *north;
  OPJ_UINT32 l_c_7;
  OPJ_UINT32 l_c_6;
  OPJ_UINT32 lu;
  OPJ_UINT32 l_c_5;
  OPJ_UINT32 l_c_4;
  OPJ_UINT32 l_c_3;
  OPJ_UINT32 l_c_2;
  OPJ_UINT32 l_c_1;
  OPJ_UINT32 l_c;
  OPJ_UINT32 partial;
  opj_flag_t flags;
  OPJ_UINT32 v;
  OPJ_UINT32 ct;
  OPJ_UINT32 a;
  OPJ_UINT32 c;
  opj_mqc_state_t **curctx;
  opj_flag_t *flagsp;
  OPJ_INT32 *data;
  opj_mqc_t *mqc;
  uint local_30;
  OPJ_UINT32 l_w;
  OPJ_UINT32 k;
  OPJ_UINT32 j;
  OPJ_UINT32 i;
  OPJ_UINT32 runlen;
  OPJ_INT32 oneplushalf;
  OPJ_INT32 half;
  OPJ_INT32 one;
  OPJ_INT32 bpno_local;
  opj_t1_t *t1_local;
  
  uVar1 = t1->w;
  flagsp = (opj_flag_t *)t1->data;
  curctx = (opj_mqc_state_t **)(t1->flags + (t1->w + 3));
  _a = (t1->mqc).curctx;
  ct = (t1->mqc).c;
  v = (t1->mqc).a;
  flags = (t1->mqc).ct;
  uVar4 = 1 << ((byte)bpno & 0x1f);
  uVar4 = uVar4 | (int)uVar4 >> 1;
  local_30 = 0;
  do {
    if ((t1->h & 0xfffffffc) <= local_30) {
      (t1->mqc).curctx = _a;
      (t1->mqc).c = ct;
      (t1->mqc).a = v;
      (t1->mqc).ct = flags;
      if (local_30 < t1->h) {
        for (k = 0; k < uVar1; k = k + 1) {
          for (l_w = 0; l_w < t1->h - local_30; l_w = l_w + 1) {
            opj_t1_dec_clnpass_step
                      (t1,(opj_flag_t *)curctx,(OPJ_INT32 *)(flagsp + l_w * uVar1),uVar4,l_w,0);
          }
          *(uint *)curctx = *(uint *)curctx & 0xb6dfffff;
          curctx = (opj_mqc_state_t **)((long)curctx + 4);
          flagsp = flagsp + 1;
        }
      }
      return;
    }
    for (k = 0; k < uVar1; k = k + 1) {
      l_c = *(OPJ_UINT32 *)curctx;
      if (l_c == 0) {
        bVar2 = true;
        _a = (t1->mqc).ctxs + 0x11;
        v = v - (*_a)->qeval;
        if (ct >> 0x10 < (*_a)->qeval) {
          if (v < (*_a)->qeval) {
            v = (*_a)->qeval;
            partial = (*_a)->mps;
            *_a = (*_a)->nmps;
          }
          else {
            v = (*_a)->qeval;
            partial = (OPJ_UINT32)(((*_a)->mps != 0 ^ 0xffU) & 1);
            *_a = (*_a)->nlps;
          }
          do {
            if (flags == 0) {
              uVar6 = (uint)(t1->mqc).bp[1];
              if (*(t1->mqc).bp == 0xff) {
                if (uVar6 < 0x90) {
                  (t1->mqc).bp = (t1->mqc).bp + 1;
                  ct = uVar6 * 0x200 + ct;
                  flags = 7;
                }
                else {
                  ct = ct + 0xff00;
                  flags = 8;
                  (t1->mqc).end_of_byte_stream_counter = (t1->mqc).end_of_byte_stream_counter + 1;
                }
              }
              else {
                (t1->mqc).bp = (t1->mqc).bp + 1;
                ct = uVar6 * 0x100 + ct;
                flags = 8;
              }
            }
            v = v << 1;
            ct = ct << 1;
            flags = flags - 1;
          } while (v < 0x8000);
        }
        else {
          ct = ct + (*_a)->qeval * -0x10000;
          if ((v & 0x8000) == 0) {
            if (v < (*_a)->qeval) {
              partial = (OPJ_UINT32)(((*_a)->mps != 0 ^ 0xffU) & 1);
              *_a = (*_a)->nlps;
            }
            else {
              partial = (*_a)->mps;
              *_a = (*_a)->nmps;
            }
            do {
              if (flags == 0) {
                uVar6 = (uint)(t1->mqc).bp[1];
                if (*(t1->mqc).bp == 0xff) {
                  if (uVar6 < 0x90) {
                    (t1->mqc).bp = (t1->mqc).bp + 1;
                    ct = uVar6 * 0x200 + ct;
                    flags = 7;
                  }
                  else {
                    ct = ct + 0xff00;
                    flags = 8;
                    (t1->mqc).end_of_byte_stream_counter = (t1->mqc).end_of_byte_stream_counter + 1;
                  }
                }
                else {
                  (t1->mqc).bp = (t1->mqc).bp + 1;
                  ct = uVar6 * 0x100 + ct;
                  flags = 8;
                }
              }
              v = v << 1;
              ct = ct << 1;
              flags = flags - 1;
            } while (v < 0x8000);
          }
          else {
            partial = (*_a)->mps;
          }
        }
        if (partial != 0) {
          _a = (t1->mqc).ctxs + 0x12;
          v = v - (*_a)->qeval;
          if (ct >> 0x10 < (*_a)->qeval) {
            if (v < (*_a)->qeval) {
              v = (*_a)->qeval;
              j = (*_a)->mps;
              *_a = (*_a)->nmps;
            }
            else {
              v = (*_a)->qeval;
              j = (OPJ_UINT32)(((*_a)->mps != 0 ^ 0xffU) & 1);
              *_a = (*_a)->nlps;
            }
            do {
              if (flags == 0) {
                uVar6 = (uint)(t1->mqc).bp[1];
                if (*(t1->mqc).bp == 0xff) {
                  if (uVar6 < 0x90) {
                    (t1->mqc).bp = (t1->mqc).bp + 1;
                    ct = uVar6 * 0x200 + ct;
                    flags = 7;
                  }
                  else {
                    ct = ct + 0xff00;
                    flags = 8;
                    (t1->mqc).end_of_byte_stream_counter = (t1->mqc).end_of_byte_stream_counter + 1;
                  }
                }
                else {
                  (t1->mqc).bp = (t1->mqc).bp + 1;
                  ct = uVar6 * 0x100 + ct;
                  flags = 8;
                }
              }
              v = v << 1;
              ct = ct << 1;
              flags = flags - 1;
            } while (v < 0x8000);
          }
          else {
            ct = ct + (*_a)->qeval * -0x10000;
            if ((v & 0x8000) == 0) {
              if (v < (*_a)->qeval) {
                j = (OPJ_UINT32)(((*_a)->mps != 0 ^ 0xffU) & 1);
                *_a = (*_a)->nlps;
              }
              else {
                j = (*_a)->mps;
                *_a = (*_a)->nmps;
              }
              do {
                if (flags == 0) {
                  uVar6 = (uint)(t1->mqc).bp[1];
                  if (*(t1->mqc).bp == 0xff) {
                    if (uVar6 < 0x90) {
                      (t1->mqc).bp = (t1->mqc).bp + 1;
                      ct = uVar6 * 0x200 + ct;
                      flags = 7;
                    }
                    else {
                      ct = ct + 0xff00;
                      flags = 8;
                      (t1->mqc).end_of_byte_stream_counter =
                           (t1->mqc).end_of_byte_stream_counter + 1;
                    }
                  }
                  else {
                    (t1->mqc).bp = (t1->mqc).bp + 1;
                    ct = uVar6 * 0x100 + ct;
                    flags = 8;
                  }
                }
                v = v << 1;
                ct = ct << 1;
                flags = flags - 1;
              } while (v < 0x8000);
            }
            else {
              j = (*_a)->mps;
            }
          }
          v = v - (*_a)->qeval;
          if (ct >> 0x10 < (*_a)->qeval) {
            if (v < (*_a)->qeval) {
              v = (*_a)->qeval;
              partial = (*_a)->mps;
              *_a = (*_a)->nmps;
            }
            else {
              v = (*_a)->qeval;
              partial = (OPJ_UINT32)(((*_a)->mps != 0 ^ 0xffU) & 1);
              *_a = (*_a)->nlps;
            }
            do {
              if (flags == 0) {
                uVar6 = (uint)(t1->mqc).bp[1];
                if (*(t1->mqc).bp == 0xff) {
                  if (uVar6 < 0x90) {
                    (t1->mqc).bp = (t1->mqc).bp + 1;
                    ct = uVar6 * 0x200 + ct;
                    flags = 7;
                  }
                  else {
                    ct = ct + 0xff00;
                    flags = 8;
                    (t1->mqc).end_of_byte_stream_counter = (t1->mqc).end_of_byte_stream_counter + 1;
                  }
                }
                else {
                  (t1->mqc).bp = (t1->mqc).bp + 1;
                  ct = uVar6 * 0x100 + ct;
                  flags = 8;
                }
              }
              v = v << 1;
              ct = ct << 1;
              flags = flags - 1;
            } while (v < 0x8000);
          }
          else {
            ct = ct + (*_a)->qeval * -0x10000;
            if ((v & 0x8000) == 0) {
              if (v < (*_a)->qeval) {
                partial = (OPJ_UINT32)(((*_a)->mps != 0 ^ 0xffU) & 1);
                *_a = (*_a)->nlps;
              }
              else {
                partial = (*_a)->mps;
                *_a = (*_a)->nmps;
              }
              do {
                if (flags == 0) {
                  uVar6 = (uint)(t1->mqc).bp[1];
                  if (*(t1->mqc).bp == 0xff) {
                    if (uVar6 < 0x90) {
                      (t1->mqc).bp = (t1->mqc).bp + 1;
                      ct = uVar6 * 0x200 + ct;
                      flags = 7;
                    }
                    else {
                      ct = ct + 0xff00;
                      flags = 8;
                      (t1->mqc).end_of_byte_stream_counter =
                           (t1->mqc).end_of_byte_stream_counter + 1;
                    }
                  }
                  else {
                    (t1->mqc).bp = (t1->mqc).bp + 1;
                    ct = uVar6 * 0x100 + ct;
                    flags = 8;
                  }
                }
                v = v << 1;
                ct = ct << 1;
                flags = flags - 1;
              } while (v < 0x8000);
            }
            else {
              partial = (*_a)->mps;
            }
          }
          switch(j * 2 | partial) {
          case 0:
            OVar5 = opj_t1_getctxtno_sc_or_spb_index
                              (0,*(OPJ_UINT32 *)((long)curctx + -4),
                               *(OPJ_UINT32 *)((long)curctx + 4),0);
            bVar3 = opj_t1_getctxno_sc(OVar5);
            ppoVar7 = (t1->mqc).ctxs + bVar3;
            v = v - (*ppoVar7)->qeval;
            if (ct >> 0x10 < (*ppoVar7)->qeval) {
              if (v < (*ppoVar7)->qeval) {
                v = (*ppoVar7)->qeval;
                partial = (*ppoVar7)->mps;
                *ppoVar7 = (*ppoVar7)->nmps;
              }
              else {
                v = (*ppoVar7)->qeval;
                partial = (OPJ_UINT32)(((*ppoVar7)->mps != 0 ^ 0xffU) & 1);
                *ppoVar7 = (*ppoVar7)->nlps;
              }
              do {
                if (flags == 0) {
                  uVar6 = (uint)(t1->mqc).bp[1];
                  if (*(t1->mqc).bp == 0xff) {
                    if (uVar6 < 0x90) {
                      (t1->mqc).bp = (t1->mqc).bp + 1;
                      ct = uVar6 * 0x200 + ct;
                      flags = 7;
                    }
                    else {
                      ct = ct + 0xff00;
                      flags = 8;
                      (t1->mqc).end_of_byte_stream_counter =
                           (t1->mqc).end_of_byte_stream_counter + 1;
                    }
                  }
                  else {
                    (t1->mqc).bp = (t1->mqc).bp + 1;
                    ct = uVar6 * 0x100 + ct;
                    flags = 8;
                  }
                }
                v = v << 1;
                ct = ct << 1;
                flags = flags - 1;
              } while (v < 0x8000);
            }
            else {
              ct = ct + (*ppoVar7)->qeval * -0x10000;
              if ((v & 0x8000) == 0) {
                if (v < (*ppoVar7)->qeval) {
                  partial = (OPJ_UINT32)(((*ppoVar7)->mps != 0 ^ 0xffU) & 1);
                  *ppoVar7 = (*ppoVar7)->nlps;
                }
                else {
                  partial = (*ppoVar7)->mps;
                  *ppoVar7 = (*ppoVar7)->nmps;
                }
                do {
                  if (flags == 0) {
                    uVar6 = (uint)(t1->mqc).bp[1];
                    if (*(t1->mqc).bp == 0xff) {
                      if (uVar6 < 0x90) {
                        (t1->mqc).bp = (t1->mqc).bp + 1;
                        ct = uVar6 * 0x200 + ct;
                        flags = 7;
                      }
                      else {
                        ct = ct + 0xff00;
                        flags = 8;
                        (t1->mqc).end_of_byte_stream_counter =
                             (t1->mqc).end_of_byte_stream_counter + 1;
                      }
                    }
                    else {
                      (t1->mqc).bp = (t1->mqc).bp + 1;
                      ct = uVar6 * 0x100 + ct;
                      flags = 8;
                    }
                  }
                  v = v << 1;
                  ct = ct << 1;
                  flags = flags - 1;
                } while (v < 0x8000);
              }
              else {
                partial = (*ppoVar7)->mps;
              }
            }
            bVar3 = opj_t1_getspb(OVar5);
            uVar6 = partial ^ bVar3;
            local_178 = uVar4;
            if (uVar6 != 0) {
              local_178 = -uVar4;
            }
            *flagsp = local_178;
            *(uint *)((long)curctx + -4) = *(uint *)((long)curctx + -4) | 0x20;
            l_c = uVar6 << 0x13 | 0x10;
            *(uint *)((long)curctx + 4) = *(uint *)((long)curctx + 4) | 8;
            puVar8 = (uint *)((long)curctx + (ulong)(t1->w + 2) * -4);
            *puVar8 = uVar6 << 0x1f | 0x10000 | *puVar8;
            puVar8[-1] = puVar8[-1] | 0x20000;
            puVar8[1] = puVar8[1] | 0x8000;
            bVar2 = false;
            break;
          case 1:
            break;
          case 2:
            goto switchD_00155c44_caseD_2;
          case 3:
            goto switchD_00155c44_caseD_3;
          default:
            goto switchD_00155c44_default;
          }
          if (bVar2) {
LAB_00156370:
            OVar5 = opj_t1_getctxtno_sc_or_spb_index
                              (l_c,*(OPJ_UINT32 *)((long)curctx + -4),
                               *(OPJ_UINT32 *)((long)curctx + 4),1);
            bVar3 = opj_t1_getctxno_sc(OVar5);
            ppoVar7 = (t1->mqc).ctxs + bVar3;
            v = v - (*ppoVar7)->qeval;
            if (ct >> 0x10 < (*ppoVar7)->qeval) {
              if (v < (*ppoVar7)->qeval) {
                v = (*ppoVar7)->qeval;
                partial = (*ppoVar7)->mps;
                *ppoVar7 = (*ppoVar7)->nmps;
              }
              else {
                v = (*ppoVar7)->qeval;
                partial = (OPJ_UINT32)(((*ppoVar7)->mps != 0 ^ 0xffU) & 1);
                *ppoVar7 = (*ppoVar7)->nlps;
              }
              do {
                if (flags == 0) {
                  uVar6 = (uint)(t1->mqc).bp[1];
                  if (*(t1->mqc).bp == 0xff) {
                    if (uVar6 < 0x90) {
                      (t1->mqc).bp = (t1->mqc).bp + 1;
                      ct = uVar6 * 0x200 + ct;
                      flags = 7;
                    }
                    else {
                      ct = ct + 0xff00;
                      flags = 8;
                      (t1->mqc).end_of_byte_stream_counter =
                           (t1->mqc).end_of_byte_stream_counter + 1;
                    }
                  }
                  else {
                    (t1->mqc).bp = (t1->mqc).bp + 1;
                    ct = uVar6 * 0x100 + ct;
                    flags = 8;
                  }
                }
                v = v << 1;
                ct = ct << 1;
                flags = flags - 1;
              } while (v < 0x8000);
            }
            else {
              ct = ct + (*ppoVar7)->qeval * -0x10000;
              if ((v & 0x8000) == 0) {
                if (v < (*ppoVar7)->qeval) {
                  partial = (OPJ_UINT32)(((*ppoVar7)->mps != 0 ^ 0xffU) & 1);
                  *ppoVar7 = (*ppoVar7)->nlps;
                }
                else {
                  partial = (*ppoVar7)->mps;
                  *ppoVar7 = (*ppoVar7)->nmps;
                }
                do {
                  if (flags == 0) {
                    uVar6 = (uint)(t1->mqc).bp[1];
                    if (*(t1->mqc).bp == 0xff) {
                      if (uVar6 < 0x90) {
                        (t1->mqc).bp = (t1->mqc).bp + 1;
                        ct = uVar6 * 0x200 + ct;
                        flags = 7;
                      }
                      else {
                        ct = ct + 0xff00;
                        flags = 8;
                        (t1->mqc).end_of_byte_stream_counter =
                             (t1->mqc).end_of_byte_stream_counter + 1;
                      }
                    }
                    else {
                      (t1->mqc).bp = (t1->mqc).bp + 1;
                      ct = uVar6 * 0x100 + ct;
                      flags = 8;
                    }
                  }
                  v = v << 1;
                  ct = ct << 1;
                  flags = flags - 1;
                } while (v < 0x8000);
              }
              else {
                partial = (*ppoVar7)->mps;
              }
            }
            bVar3 = opj_t1_getspb(OVar5);
            local_188 = uVar4;
            if ((partial ^ bVar3) != 0) {
              local_188 = -uVar4;
            }
            flagsp[uVar1] = local_188;
            *(uint *)((long)curctx + -4) = *(uint *)((long)curctx + -4) | 0x100;
            l_c = ((partial ^ bVar3) << 0x13 | 0x10) << 3 | l_c;
            *(uint *)((long)curctx + 4) = *(uint *)((long)curctx + 4) | 0x40;
          }
          else {
            bVar3 = opj_t1_getctxno_zc(&t1->mqc,l_c >> 3);
            ppoVar7 = (t1->mqc).ctxs + bVar3;
            v = v - (*ppoVar7)->qeval;
            if (ct >> 0x10 < (*ppoVar7)->qeval) {
              if (v < (*ppoVar7)->qeval) {
                v = (*ppoVar7)->qeval;
                partial = (*ppoVar7)->mps;
                *ppoVar7 = (*ppoVar7)->nmps;
              }
              else {
                v = (*ppoVar7)->qeval;
                partial = (OPJ_UINT32)(((*ppoVar7)->mps != 0 ^ 0xffU) & 1);
                *ppoVar7 = (*ppoVar7)->nlps;
              }
              do {
                if (flags == 0) {
                  uVar6 = (uint)(t1->mqc).bp[1];
                  if (*(t1->mqc).bp == 0xff) {
                    if (uVar6 < 0x90) {
                      (t1->mqc).bp = (t1->mqc).bp + 1;
                      ct = uVar6 * 0x200 + ct;
                      flags = 7;
                    }
                    else {
                      ct = ct + 0xff00;
                      flags = 8;
                      (t1->mqc).end_of_byte_stream_counter =
                           (t1->mqc).end_of_byte_stream_counter + 1;
                    }
                  }
                  else {
                    (t1->mqc).bp = (t1->mqc).bp + 1;
                    ct = uVar6 * 0x100 + ct;
                    flags = 8;
                  }
                }
                v = v << 1;
                ct = ct << 1;
                flags = flags - 1;
              } while (v < 0x8000);
            }
            else {
              ct = ct + (*ppoVar7)->qeval * -0x10000;
              if ((v & 0x8000) == 0) {
                if (v < (*ppoVar7)->qeval) {
                  partial = (OPJ_UINT32)(((*ppoVar7)->mps != 0 ^ 0xffU) & 1);
                  *ppoVar7 = (*ppoVar7)->nlps;
                }
                else {
                  partial = (*ppoVar7)->mps;
                  *ppoVar7 = (*ppoVar7)->nmps;
                }
                do {
                  if (flags == 0) {
                    uVar6 = (uint)(t1->mqc).bp[1];
                    if (*(t1->mqc).bp == 0xff) {
                      if (uVar6 < 0x90) {
                        (t1->mqc).bp = (t1->mqc).bp + 1;
                        ct = uVar6 * 0x200 + ct;
                        flags = 7;
                      }
                      else {
                        ct = ct + 0xff00;
                        flags = 8;
                        (t1->mqc).end_of_byte_stream_counter =
                             (t1->mqc).end_of_byte_stream_counter + 1;
                      }
                    }
                    else {
                      (t1->mqc).bp = (t1->mqc).bp + 1;
                      ct = uVar6 * 0x100 + ct;
                      flags = 8;
                    }
                  }
                  v = v << 1;
                  ct = ct << 1;
                  flags = flags - 1;
                } while (v < 0x8000);
              }
              else {
                partial = (*ppoVar7)->mps;
              }
            }
            if (partial != 0) goto LAB_00156370;
          }
          bVar2 = false;
switchD_00155c44_caseD_2:
          if (bVar2) {
LAB_00156a3b:
            OVar5 = opj_t1_getctxtno_sc_or_spb_index
                              (l_c,*(OPJ_UINT32 *)((long)curctx + -4),
                               *(OPJ_UINT32 *)((long)curctx + 4),2);
            bVar3 = opj_t1_getctxno_sc(OVar5);
            ppoVar7 = (t1->mqc).ctxs + bVar3;
            v = v - (*ppoVar7)->qeval;
            if (ct >> 0x10 < (*ppoVar7)->qeval) {
              if (v < (*ppoVar7)->qeval) {
                v = (*ppoVar7)->qeval;
                partial = (*ppoVar7)->mps;
                *ppoVar7 = (*ppoVar7)->nmps;
              }
              else {
                v = (*ppoVar7)->qeval;
                partial = (OPJ_UINT32)(((*ppoVar7)->mps != 0 ^ 0xffU) & 1);
                *ppoVar7 = (*ppoVar7)->nlps;
              }
              do {
                if (flags == 0) {
                  uVar6 = (uint)(t1->mqc).bp[1];
                  if (*(t1->mqc).bp == 0xff) {
                    if (uVar6 < 0x90) {
                      (t1->mqc).bp = (t1->mqc).bp + 1;
                      ct = uVar6 * 0x200 + ct;
                      flags = 7;
                    }
                    else {
                      ct = ct + 0xff00;
                      flags = 8;
                      (t1->mqc).end_of_byte_stream_counter =
                           (t1->mqc).end_of_byte_stream_counter + 1;
                    }
                  }
                  else {
                    (t1->mqc).bp = (t1->mqc).bp + 1;
                    ct = uVar6 * 0x100 + ct;
                    flags = 8;
                  }
                }
                v = v << 1;
                ct = ct << 1;
                flags = flags - 1;
              } while (v < 0x8000);
            }
            else {
              ct = ct + (*ppoVar7)->qeval * -0x10000;
              if ((v & 0x8000) == 0) {
                if (v < (*ppoVar7)->qeval) {
                  partial = (OPJ_UINT32)(((*ppoVar7)->mps != 0 ^ 0xffU) & 1);
                  *ppoVar7 = (*ppoVar7)->nlps;
                }
                else {
                  partial = (*ppoVar7)->mps;
                  *ppoVar7 = (*ppoVar7)->nmps;
                }
                do {
                  if (flags == 0) {
                    uVar6 = (uint)(t1->mqc).bp[1];
                    if (*(t1->mqc).bp == 0xff) {
                      if (uVar6 < 0x90) {
                        (t1->mqc).bp = (t1->mqc).bp + 1;
                        ct = uVar6 * 0x200 + ct;
                        flags = 7;
                      }
                      else {
                        ct = ct + 0xff00;
                        flags = 8;
                        (t1->mqc).end_of_byte_stream_counter =
                             (t1->mqc).end_of_byte_stream_counter + 1;
                      }
                    }
                    else {
                      (t1->mqc).bp = (t1->mqc).bp + 1;
                      ct = uVar6 * 0x100 + ct;
                      flags = 8;
                    }
                  }
                  v = v << 1;
                  ct = ct << 1;
                  flags = flags - 1;
                } while (v < 0x8000);
              }
              else {
                partial = (*ppoVar7)->mps;
              }
            }
            bVar3 = opj_t1_getspb(OVar5);
            local_198 = uVar4;
            if ((partial ^ bVar3) != 0) {
              local_198 = -uVar4;
            }
            flagsp[uVar1 << 1] = local_198;
            *(uint *)((long)curctx + -4) = *(uint *)((long)curctx + -4) | 0x800;
            l_c = ((partial ^ bVar3) << 0x13 | 0x10) << 6 | l_c;
            *(uint *)((long)curctx + 4) = *(uint *)((long)curctx + 4) | 0x200;
          }
          else {
            bVar3 = opj_t1_getctxno_zc(&t1->mqc,l_c >> 6);
            ppoVar7 = (t1->mqc).ctxs + bVar3;
            v = v - (*ppoVar7)->qeval;
            if (ct >> 0x10 < (*ppoVar7)->qeval) {
              if (v < (*ppoVar7)->qeval) {
                v = (*ppoVar7)->qeval;
                partial = (*ppoVar7)->mps;
                *ppoVar7 = (*ppoVar7)->nmps;
              }
              else {
                v = (*ppoVar7)->qeval;
                partial = (OPJ_UINT32)(((*ppoVar7)->mps != 0 ^ 0xffU) & 1);
                *ppoVar7 = (*ppoVar7)->nlps;
              }
              do {
                if (flags == 0) {
                  uVar6 = (uint)(t1->mqc).bp[1];
                  if (*(t1->mqc).bp == 0xff) {
                    if (uVar6 < 0x90) {
                      (t1->mqc).bp = (t1->mqc).bp + 1;
                      ct = uVar6 * 0x200 + ct;
                      flags = 7;
                    }
                    else {
                      ct = ct + 0xff00;
                      flags = 8;
                      (t1->mqc).end_of_byte_stream_counter =
                           (t1->mqc).end_of_byte_stream_counter + 1;
                    }
                  }
                  else {
                    (t1->mqc).bp = (t1->mqc).bp + 1;
                    ct = uVar6 * 0x100 + ct;
                    flags = 8;
                  }
                }
                v = v << 1;
                ct = ct << 1;
                flags = flags - 1;
              } while (v < 0x8000);
            }
            else {
              ct = ct + (*ppoVar7)->qeval * -0x10000;
              if ((v & 0x8000) == 0) {
                if (v < (*ppoVar7)->qeval) {
                  partial = (OPJ_UINT32)(((*ppoVar7)->mps != 0 ^ 0xffU) & 1);
                  *ppoVar7 = (*ppoVar7)->nlps;
                }
                else {
                  partial = (*ppoVar7)->mps;
                  *ppoVar7 = (*ppoVar7)->nmps;
                }
                do {
                  if (flags == 0) {
                    uVar6 = (uint)(t1->mqc).bp[1];
                    if (*(t1->mqc).bp == 0xff) {
                      if (uVar6 < 0x90) {
                        (t1->mqc).bp = (t1->mqc).bp + 1;
                        ct = uVar6 * 0x200 + ct;
                        flags = 7;
                      }
                      else {
                        ct = ct + 0xff00;
                        flags = 8;
                        (t1->mqc).end_of_byte_stream_counter =
                             (t1->mqc).end_of_byte_stream_counter + 1;
                      }
                    }
                    else {
                      (t1->mqc).bp = (t1->mqc).bp + 1;
                      ct = uVar6 * 0x100 + ct;
                      flags = 8;
                    }
                  }
                  v = v << 1;
                  ct = ct << 1;
                  flags = flags - 1;
                } while (v < 0x8000);
              }
              else {
                partial = (*ppoVar7)->mps;
              }
            }
            if (partial != 0) goto LAB_00156a3b;
          }
          bVar2 = false;
switchD_00155c44_caseD_3:
          if (!bVar2) {
            bVar3 = opj_t1_getctxno_zc(&t1->mqc,l_c >> 9);
            _a = (t1->mqc).ctxs + bVar3;
            v = v - (*_a)->qeval;
            if (ct >> 0x10 < (*_a)->qeval) {
              if (v < (*_a)->qeval) {
                v = (*_a)->qeval;
                partial = (*_a)->mps;
                *_a = (*_a)->nmps;
              }
              else {
                v = (*_a)->qeval;
                partial = (OPJ_UINT32)(((*_a)->mps != 0 ^ 0xffU) & 1);
                *_a = (*_a)->nlps;
              }
              do {
                if (flags == 0) {
                  uVar6 = (uint)(t1->mqc).bp[1];
                  if (*(t1->mqc).bp == 0xff) {
                    if (uVar6 < 0x90) {
                      (t1->mqc).bp = (t1->mqc).bp + 1;
                      ct = uVar6 * 0x200 + ct;
                      flags = 7;
                    }
                    else {
                      ct = ct + 0xff00;
                      flags = 8;
                      (t1->mqc).end_of_byte_stream_counter =
                           (t1->mqc).end_of_byte_stream_counter + 1;
                    }
                  }
                  else {
                    (t1->mqc).bp = (t1->mqc).bp + 1;
                    ct = uVar6 * 0x100 + ct;
                    flags = 8;
                  }
                }
                v = v << 1;
                ct = ct << 1;
                flags = flags - 1;
              } while (v < 0x8000);
            }
            else {
              ct = ct + (*_a)->qeval * -0x10000;
              if ((v & 0x8000) == 0) {
                if (v < (*_a)->qeval) {
                  partial = (OPJ_UINT32)(((*_a)->mps != 0 ^ 0xffU) & 1);
                  *_a = (*_a)->nlps;
                }
                else {
                  partial = (*_a)->mps;
                  *_a = (*_a)->nmps;
                }
                do {
                  if (flags == 0) {
                    uVar6 = (uint)(t1->mqc).bp[1];
                    if (*(t1->mqc).bp == 0xff) {
                      if (uVar6 < 0x90) {
                        (t1->mqc).bp = (t1->mqc).bp + 1;
                        ct = uVar6 * 0x200 + ct;
                        flags = 7;
                      }
                      else {
                        ct = ct + 0xff00;
                        flags = 8;
                        (t1->mqc).end_of_byte_stream_counter =
                             (t1->mqc).end_of_byte_stream_counter + 1;
                      }
                    }
                    else {
                      (t1->mqc).bp = (t1->mqc).bp + 1;
                      ct = uVar6 * 0x100 + ct;
                      flags = 8;
                    }
                  }
                  v = v << 1;
                  ct = ct << 1;
                  flags = flags - 1;
                } while (v < 0x8000);
              }
              else {
                partial = (*_a)->mps;
              }
            }
            if (partial == 0) goto switchD_00155c44_default;
          }
          OVar5 = opj_t1_getctxtno_sc_or_spb_index
                            (l_c,*(OPJ_UINT32 *)((long)curctx + -4),
                             *(OPJ_UINT32 *)((long)curctx + 4),3);
          bVar3 = opj_t1_getctxno_sc(OVar5);
          _a = (t1->mqc).ctxs + bVar3;
          v = v - (*_a)->qeval;
          if (ct >> 0x10 < (*_a)->qeval) {
            if (v < (*_a)->qeval) {
              v = (*_a)->qeval;
              partial = (*_a)->mps;
              *_a = (*_a)->nmps;
            }
            else {
              v = (*_a)->qeval;
              partial = (OPJ_UINT32)(((*_a)->mps != 0 ^ 0xffU) & 1);
              *_a = (*_a)->nlps;
            }
            do {
              if (flags == 0) {
                uVar6 = (uint)(t1->mqc).bp[1];
                if (*(t1->mqc).bp == 0xff) {
                  if (uVar6 < 0x90) {
                    (t1->mqc).bp = (t1->mqc).bp + 1;
                    ct = uVar6 * 0x200 + ct;
                    flags = 7;
                  }
                  else {
                    ct = ct + 0xff00;
                    flags = 8;
                    (t1->mqc).end_of_byte_stream_counter = (t1->mqc).end_of_byte_stream_counter + 1;
                  }
                }
                else {
                  (t1->mqc).bp = (t1->mqc).bp + 1;
                  ct = uVar6 * 0x100 + ct;
                  flags = 8;
                }
              }
              v = v << 1;
              ct = ct << 1;
              flags = flags - 1;
            } while (v < 0x8000);
          }
          else {
            ct = ct + (*_a)->qeval * -0x10000;
            if ((v & 0x8000) == 0) {
              if (v < (*_a)->qeval) {
                partial = (OPJ_UINT32)(((*_a)->mps != 0 ^ 0xffU) & 1);
                *_a = (*_a)->nlps;
              }
              else {
                partial = (*_a)->mps;
                *_a = (*_a)->nmps;
              }
              do {
                if (flags == 0) {
                  uVar6 = (uint)(t1->mqc).bp[1];
                  if (*(t1->mqc).bp == 0xff) {
                    if (uVar6 < 0x90) {
                      (t1->mqc).bp = (t1->mqc).bp + 1;
                      ct = uVar6 * 0x200 + ct;
                      flags = 7;
                    }
                    else {
                      ct = ct + 0xff00;
                      flags = 8;
                      (t1->mqc).end_of_byte_stream_counter =
                           (t1->mqc).end_of_byte_stream_counter + 1;
                    }
                  }
                  else {
                    (t1->mqc).bp = (t1->mqc).bp + 1;
                    ct = uVar6 * 0x100 + ct;
                    flags = 8;
                  }
                }
                v = v << 1;
                ct = ct << 1;
                flags = flags - 1;
              } while (v < 0x8000);
            }
            else {
              partial = (*_a)->mps;
            }
          }
          bVar3 = opj_t1_getspb(OVar5);
          uVar6 = partial ^ bVar3;
          local_1a8 = uVar4;
          if (uVar6 != 0) {
            local_1a8 = -uVar4;
          }
          flagsp[uVar1 * 3] = local_1a8;
          *(uint *)((long)curctx + -4) = *(uint *)((long)curctx + -4) | 0x4000;
          l_c = (uVar6 << 0x13 | 0x10) << 9 | l_c;
          *(uint *)((long)curctx + 4) = *(uint *)((long)curctx + 4) | 0x1000;
          puVar8 = (uint *)((long)curctx + (ulong)(t1->w + 2) * 4);
          *puVar8 = uVar6 << 0x12 | 2 | *puVar8;
          puVar8[-1] = puVar8[-1] | 4;
          puVar8[1] = puVar8[1] | 1;
          goto switchD_00155c44_default;
        }
      }
      else {
        if ((l_c & 0x200010) == 0) {
          bVar3 = opj_t1_getctxno_zc(&t1->mqc,l_c);
          _a = (t1->mqc).ctxs + bVar3;
          v = v - (*_a)->qeval;
          if (ct >> 0x10 < (*_a)->qeval) {
            if (v < (*_a)->qeval) {
              v = (*_a)->qeval;
              partial = (*_a)->mps;
              *_a = (*_a)->nmps;
            }
            else {
              v = (*_a)->qeval;
              partial = (OPJ_UINT32)(((*_a)->mps != 0 ^ 0xffU) & 1);
              *_a = (*_a)->nlps;
            }
            do {
              if (flags == 0) {
                uVar6 = (uint)(t1->mqc).bp[1];
                if (*(t1->mqc).bp == 0xff) {
                  if (uVar6 < 0x90) {
                    (t1->mqc).bp = (t1->mqc).bp + 1;
                    ct = uVar6 * 0x200 + ct;
                    flags = 7;
                  }
                  else {
                    ct = ct + 0xff00;
                    flags = 8;
                    (t1->mqc).end_of_byte_stream_counter = (t1->mqc).end_of_byte_stream_counter + 1;
                  }
                }
                else {
                  (t1->mqc).bp = (t1->mqc).bp + 1;
                  ct = uVar6 * 0x100 + ct;
                  flags = 8;
                }
              }
              v = v << 1;
              ct = ct << 1;
              flags = flags - 1;
            } while (v < 0x8000);
          }
          else {
            ct = ct + (*_a)->qeval * -0x10000;
            if ((v & 0x8000) == 0) {
              if (v < (*_a)->qeval) {
                partial = (OPJ_UINT32)(((*_a)->mps != 0 ^ 0xffU) & 1);
                *_a = (*_a)->nlps;
              }
              else {
                partial = (*_a)->mps;
                *_a = (*_a)->nmps;
              }
              do {
                if (flags == 0) {
                  uVar6 = (uint)(t1->mqc).bp[1];
                  if (*(t1->mqc).bp == 0xff) {
                    if (uVar6 < 0x90) {
                      (t1->mqc).bp = (t1->mqc).bp + 1;
                      ct = uVar6 * 0x200 + ct;
                      flags = 7;
                    }
                    else {
                      ct = ct + 0xff00;
                      flags = 8;
                      (t1->mqc).end_of_byte_stream_counter =
                           (t1->mqc).end_of_byte_stream_counter + 1;
                    }
                  }
                  else {
                    (t1->mqc).bp = (t1->mqc).bp + 1;
                    ct = uVar6 * 0x100 + ct;
                    flags = 8;
                  }
                }
                v = v << 1;
                ct = ct << 1;
                flags = flags - 1;
              } while (v < 0x8000);
            }
            else {
              partial = (*_a)->mps;
            }
          }
          if (partial != 0) {
            OVar5 = opj_t1_getctxtno_sc_or_spb_index
                              (l_c,*(OPJ_UINT32 *)((long)curctx + -4),
                               *(OPJ_UINT32 *)((long)curctx + 4),0);
            bVar3 = opj_t1_getctxno_sc(OVar5);
            _a = (t1->mqc).ctxs + bVar3;
            v = v - (*_a)->qeval;
            if (ct >> 0x10 < (*_a)->qeval) {
              if (v < (*_a)->qeval) {
                v = (*_a)->qeval;
                partial = (*_a)->mps;
                *_a = (*_a)->nmps;
              }
              else {
                v = (*_a)->qeval;
                partial = (OPJ_UINT32)(((*_a)->mps != 0 ^ 0xffU) & 1);
                *_a = (*_a)->nlps;
              }
              do {
                if (flags == 0) {
                  uVar6 = (uint)(t1->mqc).bp[1];
                  if (*(t1->mqc).bp == 0xff) {
                    if (uVar6 < 0x90) {
                      (t1->mqc).bp = (t1->mqc).bp + 1;
                      ct = uVar6 * 0x200 + ct;
                      flags = 7;
                    }
                    else {
                      ct = ct + 0xff00;
                      flags = 8;
                      (t1->mqc).end_of_byte_stream_counter =
                           (t1->mqc).end_of_byte_stream_counter + 1;
                    }
                  }
                  else {
                    (t1->mqc).bp = (t1->mqc).bp + 1;
                    ct = uVar6 * 0x100 + ct;
                    flags = 8;
                  }
                }
                v = v << 1;
                ct = ct << 1;
                flags = flags - 1;
              } while (v < 0x8000);
            }
            else {
              ct = ct + (*_a)->qeval * -0x10000;
              if ((v & 0x8000) == 0) {
                if (v < (*_a)->qeval) {
                  partial = (OPJ_UINT32)(((*_a)->mps != 0 ^ 0xffU) & 1);
                  *_a = (*_a)->nlps;
                }
                else {
                  partial = (*_a)->mps;
                  *_a = (*_a)->nmps;
                }
                do {
                  if (flags == 0) {
                    uVar6 = (uint)(t1->mqc).bp[1];
                    if (*(t1->mqc).bp == 0xff) {
                      if (uVar6 < 0x90) {
                        (t1->mqc).bp = (t1->mqc).bp + 1;
                        ct = uVar6 * 0x200 + ct;
                        flags = 7;
                      }
                      else {
                        ct = ct + 0xff00;
                        flags = 8;
                        (t1->mqc).end_of_byte_stream_counter =
                             (t1->mqc).end_of_byte_stream_counter + 1;
                      }
                    }
                    else {
                      (t1->mqc).bp = (t1->mqc).bp + 1;
                      ct = uVar6 * 0x100 + ct;
                      flags = 8;
                    }
                  }
                  v = v << 1;
                  ct = ct << 1;
                  flags = flags - 1;
                } while (v < 0x8000);
              }
              else {
                partial = (*_a)->mps;
              }
            }
            bVar3 = opj_t1_getspb(OVar5);
            uVar6 = partial ^ bVar3;
            local_1b8 = uVar4;
            if (uVar6 != 0) {
              local_1b8 = -uVar4;
            }
            *flagsp = local_1b8;
            *(uint *)((long)curctx + -4) = *(uint *)((long)curctx + -4) | 0x20;
            l_c = uVar6 << 0x13 | 0x10 | l_c;
            *(uint *)((long)curctx + 4) = *(uint *)((long)curctx + 4) | 8;
            puVar8 = (uint *)((long)curctx + (ulong)(t1->w + 2) * -4);
            *puVar8 = uVar6 << 0x1f | 0x10000 | *puVar8;
            puVar8[-1] = puVar8[-1] | 0x20000;
            puVar8[1] = puVar8[1] | 0x8000;
          }
        }
        if ((l_c & 0x1000080) == 0) {
          bVar3 = opj_t1_getctxno_zc(&t1->mqc,l_c >> 3);
          _a = (t1->mqc).ctxs + bVar3;
          v = v - (*_a)->qeval;
          if (ct >> 0x10 < (*_a)->qeval) {
            if (v < (*_a)->qeval) {
              v = (*_a)->qeval;
              partial = (*_a)->mps;
              *_a = (*_a)->nmps;
            }
            else {
              v = (*_a)->qeval;
              partial = (OPJ_UINT32)(((*_a)->mps != 0 ^ 0xffU) & 1);
              *_a = (*_a)->nlps;
            }
            do {
              if (flags == 0) {
                uVar6 = (uint)(t1->mqc).bp[1];
                if (*(t1->mqc).bp == 0xff) {
                  if (uVar6 < 0x90) {
                    (t1->mqc).bp = (t1->mqc).bp + 1;
                    ct = uVar6 * 0x200 + ct;
                    flags = 7;
                  }
                  else {
                    ct = ct + 0xff00;
                    flags = 8;
                    (t1->mqc).end_of_byte_stream_counter = (t1->mqc).end_of_byte_stream_counter + 1;
                  }
                }
                else {
                  (t1->mqc).bp = (t1->mqc).bp + 1;
                  ct = uVar6 * 0x100 + ct;
                  flags = 8;
                }
              }
              v = v << 1;
              ct = ct << 1;
              flags = flags - 1;
            } while (v < 0x8000);
          }
          else {
            ct = ct + (*_a)->qeval * -0x10000;
            if ((v & 0x8000) == 0) {
              if (v < (*_a)->qeval) {
                partial = (OPJ_UINT32)(((*_a)->mps != 0 ^ 0xffU) & 1);
                *_a = (*_a)->nlps;
              }
              else {
                partial = (*_a)->mps;
                *_a = (*_a)->nmps;
              }
              do {
                if (flags == 0) {
                  uVar6 = (uint)(t1->mqc).bp[1];
                  if (*(t1->mqc).bp == 0xff) {
                    if (uVar6 < 0x90) {
                      (t1->mqc).bp = (t1->mqc).bp + 1;
                      ct = uVar6 * 0x200 + ct;
                      flags = 7;
                    }
                    else {
                      ct = ct + 0xff00;
                      flags = 8;
                      (t1->mqc).end_of_byte_stream_counter =
                           (t1->mqc).end_of_byte_stream_counter + 1;
                    }
                  }
                  else {
                    (t1->mqc).bp = (t1->mqc).bp + 1;
                    ct = uVar6 * 0x100 + ct;
                    flags = 8;
                  }
                }
                v = v << 1;
                ct = ct << 1;
                flags = flags - 1;
              } while (v < 0x8000);
            }
            else {
              partial = (*_a)->mps;
            }
          }
          if (partial != 0) {
            OVar5 = opj_t1_getctxtno_sc_or_spb_index
                              (l_c,*(OPJ_UINT32 *)((long)curctx + -4),
                               *(OPJ_UINT32 *)((long)curctx + 4),1);
            bVar3 = opj_t1_getctxno_sc(OVar5);
            _a = (t1->mqc).ctxs + bVar3;
            v = v - (*_a)->qeval;
            if (ct >> 0x10 < (*_a)->qeval) {
              if (v < (*_a)->qeval) {
                v = (*_a)->qeval;
                partial = (*_a)->mps;
                *_a = (*_a)->nmps;
              }
              else {
                v = (*_a)->qeval;
                partial = (OPJ_UINT32)(((*_a)->mps != 0 ^ 0xffU) & 1);
                *_a = (*_a)->nlps;
              }
              do {
                if (flags == 0) {
                  uVar6 = (uint)(t1->mqc).bp[1];
                  if (*(t1->mqc).bp == 0xff) {
                    if (uVar6 < 0x90) {
                      (t1->mqc).bp = (t1->mqc).bp + 1;
                      ct = uVar6 * 0x200 + ct;
                      flags = 7;
                    }
                    else {
                      ct = ct + 0xff00;
                      flags = 8;
                      (t1->mqc).end_of_byte_stream_counter =
                           (t1->mqc).end_of_byte_stream_counter + 1;
                    }
                  }
                  else {
                    (t1->mqc).bp = (t1->mqc).bp + 1;
                    ct = uVar6 * 0x100 + ct;
                    flags = 8;
                  }
                }
                v = v << 1;
                ct = ct << 1;
                flags = flags - 1;
              } while (v < 0x8000);
            }
            else {
              ct = ct + (*_a)->qeval * -0x10000;
              if ((v & 0x8000) == 0) {
                if (v < (*_a)->qeval) {
                  partial = (OPJ_UINT32)(((*_a)->mps != 0 ^ 0xffU) & 1);
                  *_a = (*_a)->nlps;
                }
                else {
                  partial = (*_a)->mps;
                  *_a = (*_a)->nmps;
                }
                do {
                  if (flags == 0) {
                    uVar6 = (uint)(t1->mqc).bp[1];
                    if (*(t1->mqc).bp == 0xff) {
                      if (uVar6 < 0x90) {
                        (t1->mqc).bp = (t1->mqc).bp + 1;
                        ct = uVar6 * 0x200 + ct;
                        flags = 7;
                      }
                      else {
                        ct = ct + 0xff00;
                        flags = 8;
                        (t1->mqc).end_of_byte_stream_counter =
                             (t1->mqc).end_of_byte_stream_counter + 1;
                      }
                    }
                    else {
                      (t1->mqc).bp = (t1->mqc).bp + 1;
                      ct = uVar6 * 0x100 + ct;
                      flags = 8;
                    }
                  }
                  v = v << 1;
                  ct = ct << 1;
                  flags = flags - 1;
                } while (v < 0x8000);
              }
              else {
                partial = (*_a)->mps;
              }
            }
            bVar3 = opj_t1_getspb(OVar5);
            local_1c8 = uVar4;
            if ((partial ^ bVar3) != 0) {
              local_1c8 = -uVar4;
            }
            flagsp[uVar1] = local_1c8;
            *(uint *)((long)curctx + -4) = *(uint *)((long)curctx + -4) | 0x100;
            l_c = ((partial ^ bVar3) << 0x13 | 0x10) << 3 | l_c;
            *(uint *)((long)curctx + 4) = *(uint *)((long)curctx + 4) | 0x40;
          }
        }
        if ((l_c & 0x8000400) == 0) {
          bVar3 = opj_t1_getctxno_zc(&t1->mqc,l_c >> 6);
          _a = (t1->mqc).ctxs + bVar3;
          v = v - (*_a)->qeval;
          if (ct >> 0x10 < (*_a)->qeval) {
            if (v < (*_a)->qeval) {
              v = (*_a)->qeval;
              partial = (*_a)->mps;
              *_a = (*_a)->nmps;
            }
            else {
              v = (*_a)->qeval;
              partial = (OPJ_UINT32)(((*_a)->mps != 0 ^ 0xffU) & 1);
              *_a = (*_a)->nlps;
            }
            do {
              if (flags == 0) {
                uVar6 = (uint)(t1->mqc).bp[1];
                if (*(t1->mqc).bp == 0xff) {
                  if (uVar6 < 0x90) {
                    (t1->mqc).bp = (t1->mqc).bp + 1;
                    ct = uVar6 * 0x200 + ct;
                    flags = 7;
                  }
                  else {
                    ct = ct + 0xff00;
                    flags = 8;
                    (t1->mqc).end_of_byte_stream_counter = (t1->mqc).end_of_byte_stream_counter + 1;
                  }
                }
                else {
                  (t1->mqc).bp = (t1->mqc).bp + 1;
                  ct = uVar6 * 0x100 + ct;
                  flags = 8;
                }
              }
              v = v << 1;
              ct = ct << 1;
              flags = flags - 1;
            } while (v < 0x8000);
          }
          else {
            ct = ct + (*_a)->qeval * -0x10000;
            if ((v & 0x8000) == 0) {
              if (v < (*_a)->qeval) {
                partial = (OPJ_UINT32)(((*_a)->mps != 0 ^ 0xffU) & 1);
                *_a = (*_a)->nlps;
              }
              else {
                partial = (*_a)->mps;
                *_a = (*_a)->nmps;
              }
              do {
                if (flags == 0) {
                  uVar6 = (uint)(t1->mqc).bp[1];
                  if (*(t1->mqc).bp == 0xff) {
                    if (uVar6 < 0x90) {
                      (t1->mqc).bp = (t1->mqc).bp + 1;
                      ct = uVar6 * 0x200 + ct;
                      flags = 7;
                    }
                    else {
                      ct = ct + 0xff00;
                      flags = 8;
                      (t1->mqc).end_of_byte_stream_counter =
                           (t1->mqc).end_of_byte_stream_counter + 1;
                    }
                  }
                  else {
                    (t1->mqc).bp = (t1->mqc).bp + 1;
                    ct = uVar6 * 0x100 + ct;
                    flags = 8;
                  }
                }
                v = v << 1;
                ct = ct << 1;
                flags = flags - 1;
              } while (v < 0x8000);
            }
            else {
              partial = (*_a)->mps;
            }
          }
          if (partial != 0) {
            OVar5 = opj_t1_getctxtno_sc_or_spb_index
                              (l_c,*(OPJ_UINT32 *)((long)curctx + -4),
                               *(OPJ_UINT32 *)((long)curctx + 4),2);
            bVar3 = opj_t1_getctxno_sc(OVar5);
            _a = (t1->mqc).ctxs + bVar3;
            v = v - (*_a)->qeval;
            if (ct >> 0x10 < (*_a)->qeval) {
              if (v < (*_a)->qeval) {
                v = (*_a)->qeval;
                partial = (*_a)->mps;
                *_a = (*_a)->nmps;
              }
              else {
                v = (*_a)->qeval;
                partial = (OPJ_UINT32)(((*_a)->mps != 0 ^ 0xffU) & 1);
                *_a = (*_a)->nlps;
              }
              do {
                if (flags == 0) {
                  uVar6 = (uint)(t1->mqc).bp[1];
                  if (*(t1->mqc).bp == 0xff) {
                    if (uVar6 < 0x90) {
                      (t1->mqc).bp = (t1->mqc).bp + 1;
                      ct = uVar6 * 0x200 + ct;
                      flags = 7;
                    }
                    else {
                      ct = ct + 0xff00;
                      flags = 8;
                      (t1->mqc).end_of_byte_stream_counter =
                           (t1->mqc).end_of_byte_stream_counter + 1;
                    }
                  }
                  else {
                    (t1->mqc).bp = (t1->mqc).bp + 1;
                    ct = uVar6 * 0x100 + ct;
                    flags = 8;
                  }
                }
                v = v << 1;
                ct = ct << 1;
                flags = flags - 1;
              } while (v < 0x8000);
            }
            else {
              ct = ct + (*_a)->qeval * -0x10000;
              if ((v & 0x8000) == 0) {
                if (v < (*_a)->qeval) {
                  partial = (OPJ_UINT32)(((*_a)->mps != 0 ^ 0xffU) & 1);
                  *_a = (*_a)->nlps;
                }
                else {
                  partial = (*_a)->mps;
                  *_a = (*_a)->nmps;
                }
                do {
                  if (flags == 0) {
                    uVar6 = (uint)(t1->mqc).bp[1];
                    if (*(t1->mqc).bp == 0xff) {
                      if (uVar6 < 0x90) {
                        (t1->mqc).bp = (t1->mqc).bp + 1;
                        ct = uVar6 * 0x200 + ct;
                        flags = 7;
                      }
                      else {
                        ct = ct + 0xff00;
                        flags = 8;
                        (t1->mqc).end_of_byte_stream_counter =
                             (t1->mqc).end_of_byte_stream_counter + 1;
                      }
                    }
                    else {
                      (t1->mqc).bp = (t1->mqc).bp + 1;
                      ct = uVar6 * 0x100 + ct;
                      flags = 8;
                    }
                  }
                  v = v << 1;
                  ct = ct << 1;
                  flags = flags - 1;
                } while (v < 0x8000);
              }
              else {
                partial = (*_a)->mps;
              }
            }
            bVar3 = opj_t1_getspb(OVar5);
            local_1d8 = uVar4;
            if ((partial ^ bVar3) != 0) {
              local_1d8 = -uVar4;
            }
            flagsp[uVar1 << 1] = local_1d8;
            *(uint *)((long)curctx + -4) = *(uint *)((long)curctx + -4) | 0x800;
            l_c = ((partial ^ bVar3) << 0x13 | 0x10) << 6 | l_c;
            *(uint *)((long)curctx + 4) = *(uint *)((long)curctx + 4) | 0x200;
          }
        }
        if ((l_c & 0x40002000) == 0) {
          bVar3 = opj_t1_getctxno_zc(&t1->mqc,l_c >> 9);
          _a = (t1->mqc).ctxs + bVar3;
          v = v - (*_a)->qeval;
          if (ct >> 0x10 < (*_a)->qeval) {
            if (v < (*_a)->qeval) {
              v = (*_a)->qeval;
              partial = (*_a)->mps;
              *_a = (*_a)->nmps;
            }
            else {
              v = (*_a)->qeval;
              partial = (OPJ_UINT32)(((*_a)->mps != 0 ^ 0xffU) & 1);
              *_a = (*_a)->nlps;
            }
            do {
              if (flags == 0) {
                uVar6 = (uint)(t1->mqc).bp[1];
                if (*(t1->mqc).bp == 0xff) {
                  if (uVar6 < 0x90) {
                    (t1->mqc).bp = (t1->mqc).bp + 1;
                    ct = uVar6 * 0x200 + ct;
                    flags = 7;
                  }
                  else {
                    ct = ct + 0xff00;
                    flags = 8;
                    (t1->mqc).end_of_byte_stream_counter = (t1->mqc).end_of_byte_stream_counter + 1;
                  }
                }
                else {
                  (t1->mqc).bp = (t1->mqc).bp + 1;
                  ct = uVar6 * 0x100 + ct;
                  flags = 8;
                }
              }
              v = v << 1;
              ct = ct << 1;
              flags = flags - 1;
            } while (v < 0x8000);
          }
          else {
            ct = ct + (*_a)->qeval * -0x10000;
            if ((v & 0x8000) == 0) {
              if (v < (*_a)->qeval) {
                partial = (OPJ_UINT32)(((*_a)->mps != 0 ^ 0xffU) & 1);
                *_a = (*_a)->nlps;
              }
              else {
                partial = (*_a)->mps;
                *_a = (*_a)->nmps;
              }
              do {
                if (flags == 0) {
                  uVar6 = (uint)(t1->mqc).bp[1];
                  if (*(t1->mqc).bp == 0xff) {
                    if (uVar6 < 0x90) {
                      (t1->mqc).bp = (t1->mqc).bp + 1;
                      ct = uVar6 * 0x200 + ct;
                      flags = 7;
                    }
                    else {
                      ct = ct + 0xff00;
                      flags = 8;
                      (t1->mqc).end_of_byte_stream_counter =
                           (t1->mqc).end_of_byte_stream_counter + 1;
                    }
                  }
                  else {
                    (t1->mqc).bp = (t1->mqc).bp + 1;
                    ct = uVar6 * 0x100 + ct;
                    flags = 8;
                  }
                }
                v = v << 1;
                ct = ct << 1;
                flags = flags - 1;
              } while (v < 0x8000);
            }
            else {
              partial = (*_a)->mps;
            }
          }
          if (partial != 0) {
            OVar5 = opj_t1_getctxtno_sc_or_spb_index
                              (l_c,*(OPJ_UINT32 *)((long)curctx + -4),
                               *(OPJ_UINT32 *)((long)curctx + 4),3);
            bVar3 = opj_t1_getctxno_sc(OVar5);
            _a = (t1->mqc).ctxs + bVar3;
            v = v - (*_a)->qeval;
            if (ct >> 0x10 < (*_a)->qeval) {
              if (v < (*_a)->qeval) {
                v = (*_a)->qeval;
                partial = (*_a)->mps;
                *_a = (*_a)->nmps;
              }
              else {
                v = (*_a)->qeval;
                partial = (OPJ_UINT32)(((*_a)->mps != 0 ^ 0xffU) & 1);
                *_a = (*_a)->nlps;
              }
              do {
                if (flags == 0) {
                  uVar6 = (uint)(t1->mqc).bp[1];
                  if (*(t1->mqc).bp == 0xff) {
                    if (uVar6 < 0x90) {
                      (t1->mqc).bp = (t1->mqc).bp + 1;
                      ct = uVar6 * 0x200 + ct;
                      flags = 7;
                    }
                    else {
                      ct = ct + 0xff00;
                      flags = 8;
                      (t1->mqc).end_of_byte_stream_counter =
                           (t1->mqc).end_of_byte_stream_counter + 1;
                    }
                  }
                  else {
                    (t1->mqc).bp = (t1->mqc).bp + 1;
                    ct = uVar6 * 0x100 + ct;
                    flags = 8;
                  }
                }
                v = v << 1;
                ct = ct << 1;
                flags = flags - 1;
              } while (v < 0x8000);
            }
            else {
              ct = ct + (*_a)->qeval * -0x10000;
              if ((v & 0x8000) == 0) {
                if (v < (*_a)->qeval) {
                  partial = (OPJ_UINT32)(((*_a)->mps != 0 ^ 0xffU) & 1);
                  *_a = (*_a)->nlps;
                }
                else {
                  partial = (*_a)->mps;
                  *_a = (*_a)->nmps;
                }
                do {
                  if (flags == 0) {
                    uVar6 = (uint)(t1->mqc).bp[1];
                    if (*(t1->mqc).bp == 0xff) {
                      if (uVar6 < 0x90) {
                        (t1->mqc).bp = (t1->mqc).bp + 1;
                        ct = uVar6 * 0x200 + ct;
                        flags = 7;
                      }
                      else {
                        ct = ct + 0xff00;
                        flags = 8;
                        (t1->mqc).end_of_byte_stream_counter =
                             (t1->mqc).end_of_byte_stream_counter + 1;
                      }
                    }
                    else {
                      (t1->mqc).bp = (t1->mqc).bp + 1;
                      ct = uVar6 * 0x100 + ct;
                      flags = 8;
                    }
                  }
                  v = v << 1;
                  ct = ct << 1;
                  flags = flags - 1;
                } while (v < 0x8000);
              }
              else {
                partial = (*_a)->mps;
              }
            }
            bVar3 = opj_t1_getspb(OVar5);
            uVar6 = partial ^ bVar3;
            local_1e8 = uVar4;
            if (uVar6 != 0) {
              local_1e8 = -uVar4;
            }
            flagsp[uVar1 * 3] = local_1e8;
            *(uint *)((long)curctx + -4) = *(uint *)((long)curctx + -4) | 0x4000;
            l_c = (uVar6 << 0x13 | 0x10) << 9 | l_c;
            *(uint *)((long)curctx + 4) = *(uint *)((long)curctx + 4) | 0x1000;
            puVar8 = (uint *)((long)curctx + (ulong)(t1->w + 2) * 4);
            *puVar8 = uVar6 << 0x12 | 2 | *puVar8;
            puVar8[-1] = puVar8[-1] | 4;
            puVar8[1] = puVar8[1] | 1;
          }
        }
switchD_00155c44_default:
        *(OPJ_UINT32 *)curctx = l_c & 0xb6dfffff;
      }
      flagsp = flagsp + 1;
      curctx = (opj_mqc_state_t **)((long)curctx + 4);
    }
    local_30 = local_30 + 4;
    flagsp = flagsp + uVar1 * 3;
    curctx = curctx + 1;
  } while( true );
}

Assistant:

static void opj_t1_dec_clnpass_generic_novsc(
    opj_t1_t *t1,
    OPJ_INT32 bpno)
{
    opj_t1_dec_clnpass_internal(t1, bpno, OPJ_FALSE, t1->w, t1->h,
                                t1->w + 2U);
}